

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_mul_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *b_00;
  byte bVar3;
  void *data;
  
  if ((((a->ne[0] == b->ne[0]) && (a->ne[1] == b->ne[1])) && (a->ne[2] == b->ne[2])) &&
     (a->ne[3] == b->ne[3])) {
    if ((inplace) || ((a->grad == (ggml_tensor *)0x0 && (b->grad == (ggml_tensor *)0x0)))) {
      bVar3 = 0;
    }
    else {
      bVar3 = 1;
    }
    if ((bVar3 & inplace) != 1) {
      if (inplace) {
        data = a->data;
      }
      else {
        data = (void *)0x0;
      }
      pgVar1 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,data);
      pgVar1->op = GGML_OP_MUL;
      if (bVar3 == 0) {
        pgVar2 = (ggml_tensor *)0x0;
      }
      else {
        pgVar2 = ggml_new_tensor_impl(ctx,pgVar1->type,pgVar1->n_dims,pgVar1->ne,(void *)0x0);
      }
      pgVar1->grad = pgVar2;
      pgVar1->src0 = a;
      pgVar1->src1 = b;
      return pgVar1;
    }
  }
  else {
    ggml_mul_impl_cold_1();
  }
  ggml_mul_impl_cold_2();
  pgVar1 = ggml_mul_impl(ctx,a,b_00,false);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_mul_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b,
        bool inplace) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        is_node = true;
    }

    if (inplace) {
        GGML_ASSERT(is_node == false);
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_MUL;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}